

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_multi_file_info.cpp
# Opt level: O2

unique_ptr<duckdb::TableFunctionData,_std::default_delete<duckdb::TableFunctionData>,_true>
__thiscall
duckdb::CSVMultiFileInfo::InitializeBindData
          (CSVMultiFileInfo *this,MultiFileBindData *multi_file_data,
          unique_ptr<duckdb::BaseFileReaderOptions,_std::default_delete<duckdb::BaseFileReaderOptions>,_true>
          *options_p)

{
  int iVar1;
  tuple<duckdb::ReadCSVData_*,_std::default_delete<duckdb::ReadCSVData>_> in_RAX;
  pointer pBVar2;
  pointer pRVar3;
  MultiFileList *pMVar4;
  pointer *__ptr;
  __uniq_ptr_impl<duckdb::ReadCSVData,_std::default_delete<duckdb::ReadCSVData>_> local_28;
  
  local_28._M_t.
  super__Tuple_impl<0UL,_duckdb::ReadCSVData_*,_std::default_delete<duckdb::ReadCSVData>_>.
  super__Head_base<0UL,_duckdb::ReadCSVData_*,_false>._M_head_impl =
       (tuple<duckdb::ReadCSVData_*,_std::default_delete<duckdb::ReadCSVData>_>)
       (tuple<duckdb::ReadCSVData_*,_std::default_delete<duckdb::ReadCSVData>_>)
       in_RAX.
       super__Tuple_impl<0UL,_duckdb::ReadCSVData_*,_std::default_delete<duckdb::ReadCSVData>_>.
       super__Head_base<0UL,_duckdb::ReadCSVData_*,_false>._M_head_impl;
  pBVar2 = unique_ptr<duckdb::BaseFileReaderOptions,_std::default_delete<duckdb::BaseFileReaderOptions>,_true>
           ::operator->(options_p);
  make_uniq<duckdb::ReadCSVData>();
  pRVar3 = unique_ptr<duckdb::ReadCSVData,_std::default_delete<duckdb::ReadCSVData>,_true>::
           operator->((unique_ptr<duckdb::ReadCSVData,_std::default_delete<duckdb::ReadCSVData>,_true>
                       *)&local_28);
  CSVReaderOptions::operator=(&(pRVar3->super_BaseCSVData).options,(CSVReaderOptions *)(pBVar2 + 1))
  ;
  pMVar4 = shared_ptr<duckdb::MultiFileList,_true>::operator->(&multi_file_data->file_list);
  iVar1 = (*pMVar4->_vptr_MultiFileList[5])(pMVar4);
  if ((char)iVar1 == '\x02') {
    pRVar3 = unique_ptr<duckdb::ReadCSVData,_std::default_delete<duckdb::ReadCSVData>,_true>::
             operator->((unique_ptr<duckdb::ReadCSVData,_std::default_delete<duckdb::ReadCSVData>,_true>
                         *)&local_28);
    (pRVar3->super_BaseCSVData).options.multi_file_reader = true;
  }
  pRVar3 = unique_ptr<duckdb::ReadCSVData,_std::default_delete<duckdb::ReadCSVData>,_true>::
           operator->((unique_ptr<duckdb::ReadCSVData,_std::default_delete<duckdb::ReadCSVData>,_true>
                       *)&local_28);
  CSVReaderOptions::Verify(&(pRVar3->super_BaseCSVData).options,&multi_file_data->file_options);
  *(tuple<duckdb::ReadCSVData_*,_std::default_delete<duckdb::ReadCSVData>_> *)this =
       local_28._M_t.
       super__Tuple_impl<0UL,_duckdb::ReadCSVData_*,_std::default_delete<duckdb::ReadCSVData>_>.
       super__Head_base<0UL,_duckdb::ReadCSVData_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::TableFunctionData,_std::default_delete<duckdb::TableFunctionData>_>)
         (unique_ptr<duckdb::TableFunctionData,_std::default_delete<duckdb::TableFunctionData>_>)
         this;
}

Assistant:

unique_ptr<TableFunctionData> CSVMultiFileInfo::InitializeBindData(MultiFileBindData &multi_file_data,
                                                                   unique_ptr<BaseFileReaderOptions> options_p) {
	auto &options = options_p->Cast<CSVFileReaderOptions>();
	auto csv_data = make_uniq<ReadCSVData>();
	csv_data->options = std::move(options.options);
	if (multi_file_data.file_list->GetExpandResult() == FileExpandResult::MULTIPLE_FILES) {
		csv_data->options.multi_file_reader = true;
	}
	csv_data->options.Verify(multi_file_data.file_options);
	return std::move(csv_data);
}